

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
::try_emplace_impl<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
          *this,SpanKey *k)

{
  iterator iter;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>::iterator,_bool>
  *res;
  undefined1 local_30 [24];
  SpanKey *local_18;
  SpanKey *k_local;
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  *this_local;
  
  local_18 = k;
  k_local = (SpanKey *)this;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  ::
  find_or_prepare_insert<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
            (__return_storage_ptr__,
             &this->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
             ,k);
  if ((__return_storage_ptr__->second & 1U) != 0) {
    local_30._8_8_ = (__return_storage_ptr__->first).ctrl_;
    local_30._16_8_ = (__return_storage_ptr__->first).field_1.slot_;
    std::
    forward_as_tuple<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
              ((SpanKey *)local_30);
    std::forward_as_tuple<>();
    iter.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)local_30._16_8_;
    iter.ctrl_ = (ctrl_t *)local_30._8_8_;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>,absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,std::allocator<std::pair<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey_const,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey&&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>,absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,std::allocator<std::pair<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey_const,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>>>
                *)this,iter,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey_&&>
                *)local_30,(tuple<> *)((long)&res + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }